

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

string * __thiscall
pbrt::HaltonSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,HaltonSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::RandomizeStrategy_const&,pstd::vector<pbrt::DigitPermutation,pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>>*const&,long_const&,int_const&,int_const&,pbrt::Point2<int>const&,pbrt::Point2<int>const&,int_const&,int_const&>
            (__return_storage_ptr__,
             "[ HaltonSampler randomizeStrategy: %s digitPermutations: %p haltonIndex: %d dimension: %d samplesPerPixel: %d baseScales: %s baseExponents: %s multInverse: [ %d %d ] ]"
             ,&this->randomizeStrategy,&this->digitPermutations,&this->haltonIndex,&this->dimension,
             &this->samplesPerPixel,&this->baseScales,&this->baseExponents,this->multInverse,
             this->multInverse + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string HaltonSampler::ToString() const {
    return StringPrintf("[ HaltonSampler randomizeStrategy: %s digitPermutations: %p "
                        "haltonIndex: %d dimension: %d samplesPerPixel: %d "
                        "baseScales: %s baseExponents: %s multInverse: [ %d %d ] ]",
                        randomizeStrategy, digitPermutations, haltonIndex, dimension,
                        samplesPerPixel, baseScales, baseExponents, multInverse[0],
                        multInverse[1]);
}